

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_fileWatcher.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  pointer p_Var2;
  _Impl *this;
  __allocator_type __a2;
  thread watch_t;
  __shared_ptr<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2> local_78;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string file_name;
  
  std::__cxx11::string::string
            ((string *)&file_name,"./build/test.txt",(allocator *)local_68._M_pod_data);
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&file_name);
  }
  p_Var2 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<wmj::fileWatcher::fileWatcher,_std::allocator<wmj::fileWatcher::fileWatcher>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(&__a2,1);
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00104cb8;
  this = &p_Var2->_M_impl;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/test/example_fileWatcher.cpp:32:74)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/test/example_fileWatcher.cpp:32:74)>
             ::_M_manager;
  watch_t._M_id._M_thread = (id)(id)&__a2;
  wmj::fileWatcher::fileWatcher::fileWatcher
            ((fileWatcher *)this,&file_name,(function<void_()> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_78._M_ptr = (element_type *)this;
  local_78._M_refcount._M_pi = &p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<wmj::fileWatcher::fileWatcher,_std::allocator<wmj::fileWatcher::fileWatcher>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<wmj::fileWatcher::fileWatcher,_std::allocator<wmj::fileWatcher::fileWatcher>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&watch_t);
  wmj::fileWatcher::fileWatcher::startWatch((fileWatcher *)this);
  watch_t._M_id._M_thread = (id)0;
  local_68._M_unused._M_object = operator_new(0x10);
  *(undefined ***)local_68._M_unused._0_8_ = &PTR___State_00104d40;
  *(__shared_ptr<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2> **)
   ((long)local_68._M_unused._0_8_ + 8) = &local_78;
  std::thread::_M_start_thread(&watch_t,&local_68,0);
  if ((long *)local_68._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_68._M_unused._M_object + 8))();
  }
  while( true ) {
    cVar1 = getch();
    if ((cVar1 < '\x01') || (cVar1 == 'q')) break;
    if (cVar1 == 'p') {
      wmj::fileWatcher::fileWatcher::stopWatch(local_78._M_ptr);
    }
    else if (cVar1 == 'o') {
      wmj::fileWatcher::fileWatcher::startWatch(local_78._M_ptr);
    }
  }
  std::__shared_ptr<wmj::fileWatcher::fileWatcher,_(__gnu_cxx::_Lock_policy)2>::reset(&local_78);
  std::thread::join();
  std::thread::~thread(&watch_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::__cxx11::string::~string((string *)&file_name);
  return 0;
}

Assistant:

int main(int argc,char **argv) {
    std::string file_name = "./build/test.txt";
    if (argc>=2){
        file_name = argv[1];
    }
    // 创建文件监视对象，设置回调函数
    auto fw = std::make_shared<wmj::fileWatcher::fileWatcher>(file_name, []() {
        std::cout << "file change" << std::endl;
    });
    // 开始文件监视
    fw->startWatch();
    // 建立文件监视进程
    std::thread watch_t([&fw]() {
        fw->run();
    });
    char a;
    while((a = getch()) > 0) {
        // 按q结束程序
        if(a == 'q') {
            break;
        }
        // 按o开始文件监视
        if(a == 'o') {
            fw->startWatch();
        }
        // 按p结束文件监视
        if(a == 'p') {
            fw->stopWatch();
        }
    }
    // 释放资源停止run函数
    fw.reset();
    // 等待文件监视进程结束
    watch_t.join();
    return 0;
}